

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpack.cpp
# Opt level: O0

vm_val_t * __thiscall StackArgs::get(StackArgs *this,vm_val_t *val)

{
  undefined4 uVar1;
  vm_val_t *pvVar2;
  vm_val_t *in_RSI;
  long in_RDI;
  
  if (*(int *)(in_RDI + 0x14) < *(int *)(in_RDI + 0x10)) {
    vm_val_t::set_nil(in_RSI);
  }
  else {
    pvVar2 = CVmStack::get((long)*(int *)(in_RDI + 0x10));
    uVar1 = *(undefined4 *)&pvVar2->field_0x4;
    in_RSI->typ = pvVar2->typ;
    *(undefined4 *)&in_RSI->field_0x4 = uVar1;
    in_RSI->val = pvVar2->val;
  }
  return in_RSI;
}

Assistant:

virtual vm_val_t *get(vm_val_t *val)
    {
        if (curarg <= lastarg)
            *val = *stk->get(curarg);
        else
            val->set_nil();
        return val;
    }